

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O3

QString * __thiscall
QMakeGlobals::cleanSpec
          (QString *__return_storage_ptr__,QMakeGlobals *this,QMakeCmdLineParserState *state,
          QString *spec)

{
  char cVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::cleanPath((QString *)__return_storage_ptr__);
  local_48.d.ptr = (__return_storage_ptr__->d).ptr;
  local_48.d.d = (Data *)(__return_storage_ptr__->d).size;
  qVar2 = QStringView::indexOf((QStringView *)&local_48,(QChar)0x2f,0,CaseSensitive);
  if (qVar2 != -1) {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QMakeInternal::IoUtils::resolvePath(&local_48,&state->pwd,__return_storage_ptr__);
    cVar1 = QFile::exists((QString *)&local_48);
    if (cVar1 != '\0') {
      QString::operator=(__return_storage_ptr__,(QString *)&local_48);
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMakeGlobals::cleanSpec(QMakeCmdLineParserState &state, const QString &spec)
{
    QString ret = QDir::cleanPath(spec);
    if (ret.contains(QLatin1Char('/'))) {
        QString absRet = IoUtils::resolvePath(state.pwd, ret);
        if (QFile::exists(absRet))
            ret = absRet;
    }
    return ret;
}